

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O0

double find_split_dens_longform<double,double>
                 (double *x,size_t *ix_arr,size_t st,size_t end,double *split_point,size_t *split_ix
                 )

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  ulong in_RCX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  double *in_R8;
  ulong *in_R9;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  size_t row;
  double this_gain;
  double cnt_left;
  double xtot;
  double n_tot;
  double rpct_right;
  double rpct_left;
  double pct_right;
  double pct_left;
  double xmid;
  double xright;
  double xleft;
  double xmax;
  double xmin;
  double best_gain;
  double in_stack_ffffffffffffff40;
  double in_stack_ffffffffffffff48;
  byte local_aa;
  ulong local_a8;
  double local_38;
  
  local_38 = -INFINITY;
  dVar2 = *(double *)(in_RDI + *(long *)(in_RSI + in_RDX * 8) * 8);
  dVar3 = *(double *)(in_RDI + *(long *)(in_RSI + in_RCX * 8) * 8);
  lVar7 = (in_RCX - in_RDX) + 1;
  auVar16._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar16._0_8_ = lVar7;
  auVar16._12_4_ = 0x45300000;
  dVar9 = dVar3 - dVar2;
  for (local_a8 = in_RDX; local_a8 < in_RCX; local_a8 = local_a8 + 1) {
    dVar10 = *(double *)(in_RDI + *(long *)(in_RSI + local_a8 * 8) * 8);
    pdVar1 = (double *)(in_RDI + *(long *)(in_RSI + 8 + local_a8 * 8) * 8);
    if ((dVar10 != *pdVar1) || (NAN(dVar10) || NAN(*pdVar1))) {
      dVar10 = midpoint<double>(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      dVar11 = dVar10 - dVar2;
      dVar12 = dVar3 - dVar10;
      bVar4 = true;
      if ((dVar11 != 0.0) || (NAN(dVar11))) {
        bVar4 = dVar12 == 0.0;
      }
      if (!bVar4) {
        lVar8 = (local_a8 - in_RDX) + 1;
        auVar17._8_4_ = (int)((ulong)lVar8 >> 0x20);
        auVar17._0_8_ = lVar8;
        auVar17._12_4_ = 0x45300000;
        dVar13 = std::numeric_limits<double>::min();
        bVar4 = NAN(dVar11);
        uVar18 = SUB84(dVar13,0);
        uVar20 = (int)((ulong)dVar13 >> 0x20);
        if (dVar13 <= dVar11) {
          uVar18 = SUB84(dVar11,0);
          uVar20 = (int)((ulong)dVar11 >> 0x20);
        }
        dVar14 = std::numeric_limits<double>::min();
        uVar19 = SUB84(dVar14,0);
        uVar21 = (int)((ulong)dVar14 >> 0x20);
        if (dVar14 <= dVar12) {
          uVar19 = SUB84(dVar12,0);
          uVar21 = (int)((ulong)dVar12 >> 0x20);
        }
        dVar15 = ((auVar17._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) /
                 ((auVar16._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0));
        dVar13 = (dVar15 * dVar15) /
                 ((double)(~-(ulong)bVar4 & CONCAT44(uVar20,uVar18) | -(ulong)bVar4 & (ulong)dVar13)
                 / dVar9) +
                 ((1.0 - dVar15) * (1.0 - dVar15)) /
                 ((double)(~-(ulong)NAN(dVar12) & CONCAT44(uVar21,uVar19) |
                          -(ulong)NAN(dVar12) & (ulong)dVar14) / dVar9);
        uVar5 = std::isnan(dVar13);
        local_aa = 1;
        if ((uVar5 & 1) == 0) {
          iVar6 = std::isinf(dVar13);
          local_aa = (byte)iVar6;
        }
        in_stack_ffffffffffffff40 = dVar11;
        in_stack_ffffffffffffff48 = dVar12;
        if (((local_aa & 1) == 0) && (local_38 < dVar13)) {
          *in_R8 = dVar10;
          *in_R9 = local_a8;
          local_38 = dVar13;
        }
      }
    }
  }
  return local_38;
}

Assistant:

double find_split_dens_longform(real_t *restrict x, size_t *restrict ix_arr, size_t st, size_t end,
                                double &restrict split_point, size_t &restrict split_ix)
{
    double best_gain = -HUGE_VAL;
    real_t xmin = x[ix_arr[st]];
    real_t xmax = x[ix_arr[end]];
    real_t xleft, xright;
    real_t xmid;
    ldouble_safe pct_left, pct_right;
    ldouble_safe rpct_left, rpct_right;
    ldouble_safe n_tot = end - st + 1;
    ldouble_safe xtot = (ldouble_safe)xmax - (ldouble_safe)xmin;
    ldouble_safe cnt_left;
    double this_gain;

    for (size_t row = st; row < end; row++)
    {
        if (x[ix_arr[row]] == x[ix_arr[row+1]]) continue;
        xmid = midpoint(x[ix_arr[row]], x[ix_arr[row+1]]);
        xleft = xmid - xmin;
        xright = xmax - xmid;
        if (unlikely(!xleft || !xright)) continue;

        cnt_left = (ldouble_safe)(row-st+1);

        xleft = std::fmax(xleft, (real_t)std::numeric_limits<real_t>::min());
        xright = std::fmax(xright, (real_t)std::numeric_limits<real_t>::min());
        pct_left = cnt_left / n_tot;
        pct_right = (ldouble_safe)1 - pct_left;
        rpct_left = (ldouble_safe)xleft / xtot;
        rpct_right = (ldouble_safe)xright / xtot;

        this_gain = square(pct_left) / rpct_left + square(pct_right) / rpct_right;
        if (unlikely(is_na_or_inf(this_gain))) continue;
        if (this_gain > best_gain)
        {
            best_gain = this_gain;
            split_point = xmid;
            split_ix = row;
        }
    }

    return best_gain;
}